

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_base64.c
# Opt level: O2

char * cmime_base64_encode_string(char *source)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  uchar uVar4;
  int len;
  long lVar5;
  int iVar6;
  long lVar7;
  uchar local_37 [4];
  uchar local_33 [4];
  uchar out [4];
  uchar in [3];
  
  sVar1 = strlen(source);
  iVar6 = (int)sVar1;
  pcVar2 = (char *)calloc((long)(int)((double)iVar6 * 0.35 + (double)iVar6 + 1.0),2);
  lVar7 = 0;
  for (lVar5 = 0; lVar5 < iVar6; lVar5 = lVar5 + 3) {
    len = 0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if ((int)lVar3 + (int)lVar5 < iVar6) {
        uVar4 = source[lVar3];
        len = len + 1;
      }
      else {
        uVar4 = '\0';
      }
      local_33[lVar3] = uVar4;
    }
    cmime_base64_encode_block(local_33,local_37,len);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      pcVar2[lVar3 + (int)lVar7] = local_37[lVar3];
    }
    source = source + 3;
    lVar7 = (long)(int)lVar7 + 4;
  }
  return pcVar2;
}

Assistant:

char *cmime_base64_encode_string(const char *source) {
    unsigned char in[3], out[4];
    int i,j;
    int len;
    char *target = NULL;
    int pos = 0;

    /* laenge der ein/ausgabe */
    int source_len = strlen(source);
    int target_len = source_len + (0.35 * source_len) + 1;

    target = (char *)calloc(target_len, sizeof(char) + 1);

    for(j=0; j<source_len; j+=3) {
        len = 0;

        for(i=0; i<3; i++) {
            if((i + j) < source_len) {
                in[i] = (unsigned char)source[j + i];
                len++;
            } else {
                in[i] = 0;
            }
        }

        cmime_base64_encode_block(in, out, len);
        for(i=0; i<4; i++) {
            target[pos++] = out[i];
        }
    }

    return(target);
}